

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::Init(BaseTag *this,istream *is)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ACT_TYPE AVar4;
  TagState *this_00;
  reference ppTVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  pointer ppVar9;
  State local_b0 [8];
  State next;
  _Self local_90;
  _Self local_88;
  const_iterator it;
  int next_rob;
  int a;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_48;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *opp_distribution
  ;
  int s_1;
  int local_2c;
  int local_28;
  int s;
  int opp;
  int rob;
  TagState *state;
  istream *is_local;
  BaseTag *this_local;
  
  state = (TagState *)is;
  is_local = (istream *)this;
  ReadConfig(this,is);
  iVar2 = (**(code **)(*(long *)this + 0x10))();
  std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::resize
            (&this->states_,(long)iVar2);
  iVar2 = (**(code **)(*(long *)this + 0x10))();
  std::vector<int,_std::allocator<int>_>::resize(&this->rob_,(long)iVar2);
  iVar2 = (**(code **)(*(long *)this + 0x10))();
  std::vector<int,_std::allocator<int>_>::resize(&this->opp_,(long)iVar2);
  for (s = 0; iVar2 = s, iVar3 = despot::Floor::NumCells(), iVar2 < iVar3; s = s + 1) {
    for (local_28 = 0; iVar2 = local_28, iVar3 = despot::Floor::NumCells(), iVar2 < iVar3;
        local_28 = local_28 + 1) {
      local_2c = RobOppIndicesToStateIndex(this,s,local_28);
      this_00 = (TagState *)operator_new(0x20);
      TagState::TagState(this_00,local_2c);
      _opp = this_00;
      ppTVar5 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::operator[]
                          (&this->states_,(long)local_2c);
      iVar3 = s;
      *ppTVar5 = this_00;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->rob_,(long)local_2c);
      iVar2 = local_28;
      *pvVar6 = iVar3;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->opp_,(long)local_2c);
      *pvVar6 = iVar2;
    }
  }
  iVar2 = (**(code **)(*(long *)this + 0x10))();
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(&this->transition_probabilities_,(long)iVar2);
  opp_distribution._0_4_ = 0;
  do {
    iVar2 = (int)opp_distribution;
    iVar3 = (**(code **)(*(long *)this + 0x10))();
    if (iVar3 <= iVar2) {
      return;
    }
    pvVar7 = std::
             vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
             ::operator[](&this->transition_probabilities_,(long)(int)opp_distribution);
    iVar2 = (**(code **)(*(long *)this + 0x18))();
    std::
    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
    ::resize(pvVar7,(long)iVar2);
    OppTransitionDistribution
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               &next_rob,this,(int)opp_distribution);
    local_48 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               &next_rob;
    for (it._M_node._4_4_ = 0; iVar2 = it._M_node._4_4_,
        iVar3 = (**(code **)(*(long *)this + 0x18))(), iVar2 < iVar3;
        it._M_node._4_4_ = it._M_node._4_4_ + 1) {
      pvVar7 = std::
               vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ::operator[](&this->transition_probabilities_,(long)(int)opp_distribution);
      pvVar8 = std::
               vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
               ::operator[](pvVar7,(long)it._M_node._4_4_);
      std::vector<despot::State,_std::allocator<despot::State>_>::clear(pvVar8);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->rob_,(long)(int)opp_distribution);
      it._M_node._0_4_ = NextRobPosition(this,*pvVar6,it._M_node._4_4_);
      iVar2 = it._M_node._4_4_;
      AVar4 = TagAction(this);
      if (iVar2 == AVar4) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->rob_,(long)(int)opp_distribution);
        iVar2 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->opp_,(long)(int)opp_distribution);
        if (iVar2 != *pvVar6) goto LAB_0012b03a;
      }
      else {
LAB_0012b03a:
        local_88._M_node =
             (_Base_ptr)
             std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             begin(local_48);
        while( true ) {
          local_90._M_node =
               (_Base_ptr)
               std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::end(local_48);
          bVar1 = std::operator!=(&local_88,&local_90);
          if (!bVar1) break;
          despot::State::State(local_b0);
          iVar2 = (int)it._M_node;
          ppVar9 = std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->
                             (&local_88);
          RobOppIndicesToStateIndex(this,iVar2,ppVar9->first);
          std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator->(&local_88);
          pvVar7 = std::
                   vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                   ::operator[](&this->transition_probabilities_,(long)(int)opp_distribution);
          pvVar8 = std::
                   vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                   ::operator[](pvVar7,(long)it._M_node._4_4_);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(pvVar8,local_b0);
          despot::State::~State(local_b0);
          std::_Rb_tree_const_iterator<std::pair<const_int,_double>_>::operator++(&local_88,0);
        }
      }
    }
    std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::~map
              ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
               &next_rob);
    opp_distribution._0_4_ = (int)opp_distribution + 1;
  } while( true );
}

Assistant:

void BaseTag::Init(istream& is) {
	ReadConfig(is);

	TagState* state;
	states_.resize(NumStates());
	rob_.resize(NumStates());
	opp_.resize(NumStates());
	for (int rob = 0; rob < floor_.NumCells(); rob++) {
		for (int opp = 0; opp < floor_.NumCells(); opp++) {
			int s = RobOppIndicesToStateIndex(rob, opp);
			state = new TagState(s);
			states_[s] = state;
			rob_[s] = rob;
			opp_[s] = opp;
		}
	}

	// Build transition matrix
	transition_probabilities_.resize(NumStates());
	for (int s = 0; s < NumStates(); s++) {
		transition_probabilities_[s].resize(NumActions());

		const map<int, double>& opp_distribution = OppTransitionDistribution(s);
		for (int a = 0; a < NumActions(); a++) {
			transition_probabilities_[s][a].clear();

			int next_rob = NextRobPosition(rob_[s], a);

			if (!(a == TagAction() && rob_[s] == opp_[s])) { // No transition upon termination
				for (map<int, double>::const_iterator it = opp_distribution.begin();
					it != opp_distribution.end(); it++) {
					State next;
					next.state_id = RobOppIndicesToStateIndex(next_rob,
						it->first);
					next.weight = it->second;

					transition_probabilities_[s][a].push_back(next);
				}
			}
		}
	}
}